

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iraffits.c
# Opt level: O3

char * iraf2str(char *irafstring,int nchar)

{
  char cVar1;
  char *pcVar2;
  ulong uVar3;
  
  pcVar2 = (char *)calloc((ulong)(nchar + 1),1);
  if (pcVar2 == (char *)0x0) {
    ffpmsg("IRAF2STR Cannot allocate memory for string variable");
  }
  else if (0 < nchar) {
    cVar1 = *irafstring;
    uVar3 = 0;
    do {
      pcVar2[uVar3] = irafstring[uVar3 * 2 + (ulong)(cVar1 == '\0')];
      uVar3 = uVar3 + 1;
    } while ((uint)nchar != uVar3);
  }
  return pcVar2;
}

Assistant:

static char *iraf2str (

char	*irafstring,	/* IRAF 2-byte/character string */
int	nchar)		/* Number of characters in string */
{
    char *string;
    int i, j;

    string = (char *) calloc (nchar+1, 1);
    if (string == NULL) {
	ffpmsg("IRAF2STR Cannot allocate memory for string variable");
	return (NULL);
	}

    /* the chars are in bytes 1, 3, 5, ... if bigendian format (SUN) */
    /* else in bytes 0, 2, 4, ... if little endian format (Alpha)    */

    if (irafstring[0] != 0)
	j = 0;
    else
	j = 1;

    /* Convert appropriate byte of input to output character */
    for (i = 0; i < nchar; i++) {
	string[i] = irafstring[j];
	j = j + 2;
	}

    return (string);
}